

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

void Js::DynamicTypeHandler::AdjustSlots
               (DynamicObject *object,PropertyIndex newInlineSlotCapacity,int newAuxSlotCapacity)

{
  ushort uVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *this;
  DynamicTypeHandler *this_00;
  WriteBarrierPtr<void> *this_01;
  uint uVar6;
  ulong uVar7;
  FinalizableObject *this_02;
  RecyclableObject *pRVar8;
  WriteBarrierPtr<void> *other;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x2a8,"(object)","object");
    if (!bVar4) goto LAB_00ccc97e;
    *puVar5 = 0;
  }
  this = RecyclableObject::GetRecycler(&object->super_RecyclableObject);
  local_60 = (undefined1  [8])&void*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9f310e8;
  data.filename._0_4_ = 0x2ac;
  data.plusSize = (long)newAuxSlotCapacity;
  Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_60);
  data._32_8_ = Memory::Recycler::AllocZeroWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (this,(long)newAuxSlotCapacity << 3);
  this_00 = DynamicObject::GetTypeHandler(object);
  uVar1 = this_00->inlineSlotCapacity;
  if (uVar1 == newInlineSlotCapacity) {
    uVar6 = this_00->slotCapacity - (uint)uVar1;
    if (newAuxSlotCapacity <= (int)uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2b5,"(oldAuxSlotCapacity < newAuxSlotCapacity)",
                                  "oldAuxSlotCapacity < newAuxSlotCapacity");
      if (!bVar4) goto LAB_00ccc97e;
      *puVar5 = 0;
    }
    if (0 < (int)uVar6) {
      other = (object->auxSlots).ptr;
      if (other == (WriteBarrierPtr<void> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0x2ba,"(oldAuxSlots)","oldAuxSlots");
        if (!bVar4) {
LAB_00ccc97e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      uVar7 = 0;
      this_01 = (WriteBarrierPtr<void> *)data._32_8_;
      do {
        Memory::WriteBarrierPtr<void>::operator=(this_01,other);
        uVar7 = uVar7 + 1;
        this_01 = this_01 + 1;
        other = other + 1;
      } while (uVar7 < uVar6);
    }
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
              (&object->auxSlots,(WriteBarrierPtr<void> *)data._32_8_);
  }
  else {
    bVar4 = IsObjectHeaderInlinedTypeHandler(this_00);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cc,"(oldTypeHandler->IsObjectHeaderInlinedTypeHandler())",
                                  "oldTypeHandler->IsObjectHeaderInlinedTypeHandler()");
      if (!bVar4) goto LAB_00ccc97e;
      *puVar5 = 0;
    }
    if (uVar1 <= newInlineSlotCapacity) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cd,"(oldInlineSlotCapacity > newInlineSlotCapacity)",
                                  "oldInlineSlotCapacity > newInlineSlotCapacity");
      if (!bVar4) goto LAB_00ccc97e;
      *puVar5 = 0;
    }
    if ((uint)uVar1 - (uint)newInlineSlotCapacity != 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2ce,
                                  "(oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                                  ,
                                  "oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                                 );
      if (!bVar4) goto LAB_00ccc97e;
      *puVar5 = 0;
    }
    if (newAuxSlotCapacity < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cf,
                                  "(newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                                  ,
                                  "newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                                 );
      if (!bVar4) goto LAB_00ccc97e;
      *puVar5 = 0;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ObjectHeaderInliningPhase);
    if (bVar4) {
      Output::Print(L"ObjectHeaderInlining: Moving inlined properties to aux slots.\n");
      Output::Flush();
    }
    uVar3 = data._32_8_;
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              ((WriteBarrierPtr<void> *)data._32_8_,
               (&(object->super_RecyclableObject).super_FinalizableObject)[uVar1].
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              ((WriteBarrierPtr<void> *)(uVar3 + 8),
               (&(object->super_RecyclableObject).type)[uVar1].ptr);
    if (newInlineSlotCapacity != 0) {
      bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ObjectHeaderInliningPhase);
      if (bVar4) {
        Output::Print(L"ObjectHeaderInlining: Moving inlined properties out of the object header.\n"
                     );
        Output::Flush();
      }
      this_02 = &object[1].super_RecyclableObject.super_FinalizableObject +
                (ushort)(newInlineSlotCapacity - 1);
      pRVar8 = (RecyclableObject *)(&object->auxSlots + (ushort)(newInlineSlotCapacity - 1));
      do {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  ((WriteBarrierPtr<void> *)this_02,*(Type **)&pRVar8->super_FinalizableObject);
        this_02 = this_02 + -1;
        pRVar8 = (RecyclableObject *)((long)(pRVar8 + 0xffffffffffffffff) + 8);
        newInlineSlotCapacity = newInlineSlotCapacity - 1;
      } while (newInlineSlotCapacity != 0);
    }
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
              (&object->auxSlots,(WriteBarrierPtr<void> *)data._32_8_);
    object->field_1 = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
  }
  return;
}

Assistant:

void DynamicTypeHandler::AdjustSlots(
        DynamicObject *const object,
        const PropertyIndex newInlineSlotCapacity,
        const int newAuxSlotCapacity)
    {
        Assert(object);

        // Allocate new aux slot array
        Recycler *const recycler = object->GetRecycler();
        TRACK_ALLOC_INFO(recycler, Var, Recycler, 0, newAuxSlotCapacity);
        Field(Var) *const newAuxSlots = reinterpret_cast<Field(Var) *>(
            recycler->AllocZero(newAuxSlotCapacity * sizeof(Field(Var))));

        DynamicTypeHandler *const oldTypeHandler = object->GetTypeHandler();
        const PropertyIndex oldInlineSlotCapacity = oldTypeHandler->GetInlineSlotCapacity();
        if(oldInlineSlotCapacity == newInlineSlotCapacity)
        {
            const int oldAuxSlotCapacity = oldTypeHandler->GetSlotCapacity() - oldInlineSlotCapacity;
            AssertOrFailFast(oldAuxSlotCapacity < newAuxSlotCapacity);
            if(oldAuxSlotCapacity > 0)
            {
                // Copy aux slots to the new array
                Field(Var) *const oldAuxSlots = object->auxSlots;
                Assert(oldAuxSlots);
                int i = 0;
                do
                {
                    newAuxSlots[i] = oldAuxSlots[i];
                } while(++i < oldAuxSlotCapacity);

            #ifdef EXPLICIT_FREE_SLOTS
                recycler->ExplicitFreeNonLeaf(oldAuxSlots, oldAuxSlotCapacity * sizeof(Var));
            #endif
            }

            object->auxSlots = newAuxSlots;
            return;
        }

        // An object header-inlined type handler is transitioning into one that is not. Some inline slots need to move, and
        // there are no old aux slots that need to be copied.
        Assert(oldTypeHandler->IsObjectHeaderInlinedTypeHandler());
        Assert(oldInlineSlotCapacity > newInlineSlotCapacity);
        Assert(oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
        Assert(newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());

        // Move the last few inline slots into the aux slots
        if(PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
        {
            Output::Print(_u("ObjectHeaderInlining: Moving inlined properties to aux slots.\n"));
            Output::Flush();
        }
        Var *const oldInlineSlots =
            reinterpret_cast<Var *>(
                reinterpret_cast<uintptr_t>(object) + DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots());
        Assert(DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() == 2);
        newAuxSlots[0] = oldInlineSlots[oldInlineSlotCapacity - 2];
        newAuxSlots[1] = oldInlineSlots[oldInlineSlotCapacity - 1];

        if(newInlineSlotCapacity > 0)
        {
            // Move the remaining inline slots such that none are object header-inlined. Copy backwards, as the two buffers may
            // overlap, with the new inline slot array starting beyond the start of the old inline slot array.
            if(PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
            {
                Output::Print(_u("ObjectHeaderInlining: Moving inlined properties out of the object header.\n"));
                Output::Flush();
            }
            Field(Var) *const newInlineSlots = reinterpret_cast<Field(Var) *>(object + 1);
            PropertyIndex i = newInlineSlotCapacity;
            do
            {
                --i;
                newInlineSlots[i] = oldInlineSlots[i];
            } while(i > 0);
        }

        object->auxSlots = newAuxSlots;
        object->objectArray = nullptr;
    }